

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<ninx::parser::element::IfStatement,_std::default_delete<ninx::parser::element::IfStatement>_>
 __thiscall ninx::parser::Parser::parse_if_statement(Parser *this)

{
  TokenReader *this_00;
  _Tuple_impl<0UL,_ninx::parser::element::IfStatement_*,_std::default_delete<ninx::parser::element::IfStatement>_>
  _Var1;
  int iVar2;
  IfCase *pIVar3;
  IfStatement *this_01;
  undefined8 extraout_RAX;
  Parser *in_RSI;
  undefined8 uVar4;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_> body;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  condition;
  __single_object elseif_case;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  elseif_body;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  elseif_condition;
  __single_object main_case;
  vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  cases;
  __single_object *if_condition;
  _Head_base<0UL,_ninx::parser::element::Block_*,_false> local_b0;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  _Head_base<0UL,_ninx::parser::element::IfCase_*,_false> local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_68;
  vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  local_58;
  _Tuple_impl<0UL,_ninx::parser::element::IfStatement_*,_std::default_delete<ninx::parser::element::IfStatement>_>
  local_38;
  
  this_00 = &in_RSI->reader;
  local_38.super__Head_base<0UL,_ninx::parser::element::IfStatement_*,_false>._M_head_impl =
       (_Head_base<0UL,_ninx::parser::element::IfStatement_*,_false>)
       (_Head_base<0UL,_ninx::parser::element::IfStatement_*,_false>)this;
  iVar2 = TokenReader::check_type(this_00,IF);
  if (iVar2 != 1) {
    local_78._M_allocated_capacity = (size_type)&aStack_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Expected If statement","");
    generate_exception(in_RSI,(string *)&local_78);
    if (local_80._M_head_impl != (IfCase *)0x0) {
      (*((local_80._M_head_impl)->super_ASTElement)._vptr_ASTElement[1])();
    }
    local_80._M_head_impl = (IfCase *)0x0;
    if ((long *)local_a8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
    local_a8._0_8_ = (pointer)0x0;
    if ((Block *)local_a8._8_8_ != (Block *)0x0) {
      (*(code *)(((_Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                   *)local_a8._8_8_)->_M_impl).super__Vector_impl_data._M_start[1]._M_t)();
    }
    local_a8._8_8_ = 0;
    std::
    vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
    ::~vector(&local_58);
    _Unwind_Resume(extraout_RAX);
  }
  TokenReader::get_token(this_00);
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parse_level_3_expression((Parser *)(local_a8 + 8));
  parse_block((Parser *)local_a8);
  pIVar3 = (IfCase *)operator_new(0x28);
  local_78._M_allocated_capacity = local_a8._8_8_;
  local_a8._8_8_ = (long *)0x0;
  local_b0._M_head_impl = (Block *)local_a8._0_8_;
  local_a8._0_8_ = (long *)0x0;
  element::IfCase::IfCase
            (pIVar3,(unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                     *)&local_78._M_allocated_capacity,
             (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
              *)&local_b0);
  local_80._M_head_impl = pIVar3;
  if (local_b0._M_head_impl != (Block *)0x0) {
    (*((local_b0._M_head_impl)->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement
      [1])();
  }
  local_b0._M_head_impl = (Block *)0x0;
  if ((Block *)local_78._M_allocated_capacity != (Block *)0x0) {
    (**(code **)(*(long *)local_78._M_allocated_capacity + 8))();
  }
  std::
  vector<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>,std::allocator<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>>
  ::
  emplace_back<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>
            ((vector<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>,std::allocator<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>>
              *)&local_58,
             (unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
              *)&local_80);
  while (iVar2 = TokenReader::check_type(this_00,ELSEIF), iVar2 == 1) {
    TokenReader::get_token(this_00);
    parse_level_3_expression((Parser *)&local_88);
    parse_block((Parser *)(local_98._M_local_buf + 8));
    pIVar3 = (IfCase *)operator_new(0x28);
    local_78._M_allocated_capacity = (size_type)local_88._M_p;
    local_88._M_p = (pointer)0x0;
    local_b0._M_head_impl = (Block *)local_98._8_8_;
    local_98._8_8_ = 0;
    element::IfCase::IfCase
              (pIVar3,(unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                       *)&local_78._M_allocated_capacity,
               (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)&local_b0);
    local_98._M_allocated_capacity = (size_type)pIVar3;
    if (local_b0._M_head_impl != (Block *)0x0) {
      (*((local_b0._M_head_impl)->super_Expression).super_Statement.super_ASTElement.
        _vptr_ASTElement[1])();
    }
    local_b0._M_head_impl = (Block *)0x0;
    if ((Block *)local_78._M_allocated_capacity != (Block *)0x0) {
      (**(code **)(*(long *)local_78._M_allocated_capacity + 8))();
    }
    std::
    vector<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>,std::allocator<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>>
    ::
    emplace_back<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>
              ((vector<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>,std::allocator<std::unique_ptr<ninx::parser::element::IfCase,std::default_delete<ninx::parser::element::IfCase>>>>
                *)&local_58,
               (unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
                *)&local_98._M_allocated_capacity);
    if ((IfCase *)local_98._M_allocated_capacity != (IfCase *)0x0) {
      (**(code **)(*(long *)local_98._M_allocated_capacity + 8))();
    }
  }
  iVar2 = TokenReader::check_type(this_00,ELSE);
  uVar4 = (Block *)0x0;
  if (iVar2 == 1) {
    TokenReader::get_token(this_00);
    parse_block((Parser *)&local_78);
    uVar4 = local_78._M_allocated_capacity;
  }
  this_01 = (IfStatement *)operator_new(0x38);
  local_78._M_allocated_capacity =
       (size_type)
       local_58.
       super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78._8_8_ =
       local_58.
       super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  aStack_68._M_allocated_capacity =
       (size_type)
       local_58.
       super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0._M_head_impl = (Block *)uVar4;
  element::IfStatement::IfStatement
            (this_01,(vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
                      *)&local_78,
             (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
              *)&local_b0);
  _Var1.super__Head_base<0UL,_ninx::parser::element::IfStatement_*,_false>._M_head_impl =
       local_38.super__Head_base<0UL,_ninx::parser::element::IfStatement_*,_false>._M_head_impl;
  *(IfStatement **)
   local_38.super__Head_base<0UL,_ninx::parser::element::IfStatement_*,_false>._M_head_impl =
       this_01;
  if (local_b0._M_head_impl != (Block *)0x0) {
    (*(code *)(((_Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                 *)&(local_b0._M_head_impl)->super_Expression)->_M_impl).super__Vector_impl_data.
              _M_start[1]._M_t.
              super___uniq_ptr_impl<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
              ._M_t)();
  }
  local_b0._M_head_impl = (Block *)0x0;
  std::
  vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  ::~vector((vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
             *)&local_78);
  if (local_80._M_head_impl != (IfCase *)0x0) {
    (*((local_80._M_head_impl)->super_ASTElement)._vptr_ASTElement[1])();
  }
  if ((long *)local_a8._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a8._0_8_ + 8))();
  }
  if ((long *)local_a8._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a8._8_8_ + 8))();
  }
  std::
  vector<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
  ::~vector(&local_58);
  return (unique_ptr<ninx::parser::element::IfStatement,_std::default_delete<ninx::parser::element::IfStatement>_>
          )_Var1.super__Head_base<0UL,_ninx::parser::element::IfStatement_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<IfStatement> ninx::parser::Parser::parse_if_statement() {
    if (reader.check_type(Type::IF) != 1) {
        generate_exception("Expected If statement");
    }
    reader.get_token();

    std::vector<std::unique_ptr<IfCase>> cases;

    // Parse the main condition
    auto condition {parse_expression()};
    auto body {parse_block()};
    auto main_case = std::make_unique<IfCase>(std::move(condition), std::move(body));
    cases.push_back(std::move(main_case));

    // Parse optional else if statements
    while(reader.check_type(Type::ELSEIF) == 1) {
        reader.get_token();

        auto elseif_condition {parse_expression()};
        auto elseif_body {parse_block()};
        auto elseif_case = std::make_unique<IfCase>(std::move(elseif_condition), std::move(elseif_body));
        cases.push_back(std::move(elseif_case));
    }

    // Parse optional else statement
    std::unique_ptr<Block> else_body {nullptr};
    if (reader.check_type(Type::ELSE) == 1){
        reader.get_token();

        else_body = parse_block();
    }


    auto if_condition = std::make_unique<IfStatement>(std::move(cases), std::move(else_body));

    return if_condition;
}